

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O2

void __thiscall LexerReadIdent::Run(LexerReadIdent *this)

{
  Test *pTVar1;
  bool bVar2;
  string ident;
  Lexer lexer;
  
  Lexer::Lexer(&lexer,"foo baR baz_123 foo-bar");
  pTVar1 = g_current_test;
  ident._M_dataplus._M_p = (pointer)&ident.field_2;
  ident._M_string_length = 0;
  ident.field_2._M_local_buf[0] = '\0';
  bVar2 = Lexer::ReadIdent(&lexer,&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2d,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("foo",&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2e,"\"foo\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(&lexer,&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2f,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("baR",&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x30,"\"baR\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(&lexer,&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x31,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("baz_123",&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x32,"\"baz_123\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(&lexer,&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x33,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("foo-bar",&ident);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x34,"\"foo-bar\" == ident");
  std::__cxx11::string::~string((string *)&ident);
  return;
}

Assistant:

TEST(Lexer, ReadIdent) {
  Lexer lexer("foo baR baz_123 foo-bar");
  string ident;
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("baR", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("baz_123", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo-bar", ident);
}